

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O3

void printOperand(MCInst *MI,int opNum,SStream *O)

{
  long lVar1;
  uint8_t *puVar2;
  cs_detail *pcVar3;
  uint uVar4;
  _Bool _Var5;
  uint uVar6;
  sparc_reg sVar7;
  MCOperand *op;
  int64_t iVar8;
  ulong uVar9;
  char *fmt;
  int iVar10;
  
  op = MCInst_getOperand(MI,opNum);
  _Var5 = MCOperand_isReg(op);
  if (_Var5) {
    uVar6 = MCOperand_getReg(op);
    SStream_concat0(O,"%");
    SStream_concat0(O,getRegisterName_AsmStrs +
                      *(uint *)(getRegisterName_RegAsmOffset + (ulong)(uVar6 - 1) * 4));
    sVar7 = Sparc_map_register(uVar6);
    if (MI->csh->detail == CS_OPT_OFF) {
      return;
    }
    pcVar3 = MI->flat_insn->detail;
    uVar9 = (ulong)(pcVar3->field_6).x86.rex;
    if (MI->csh->doing_mem == true) {
      lVar1 = uVar9 * 0xc;
      if (pcVar3->groups[lVar1 + 0x1e] != '\0') {
        pcVar3->groups[lVar1 + 0x1f] = (uint8_t)sVar7;
        return;
      }
      pcVar3->groups[lVar1 + 0x1e] = (uint8_t)sVar7;
      return;
    }
    puVar2 = pcVar3->groups + uVar9 * 0xc + 0x1a;
    puVar2[0] = '\x01';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    pcVar3 = MI->flat_insn->detail;
    *(sparc_reg *)(pcVar3->groups + (ulong)(pcVar3->field_6).x86.rex * 0xc + 0x1e) = sVar7;
    goto LAB_001bb658;
  }
  _Var5 = MCOperand_isImm(op);
  if (!_Var5) {
    return;
  }
  iVar8 = MCOperand_getImm(op);
  uVar6 = (uint)iVar8;
  switch(MI->Opcode) {
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x95:
  case 0x96:
    iVar10 = (int)(uVar6 << 10) >> 8;
    break;
  default:
    goto switchD_001bb560_caseD_4a;
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
    iVar10 = (int)(uVar6 << 0xd) >> 0xb;
    break;
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
    iVar10 = (int)(short)iVar8 << 2;
    break;
  case 0x72:
    iVar10 = (int)(uVar6 << 2) >> 2;
  }
  uVar6 = iVar10 + (int)MI->address;
switchD_001bb560_caseD_4a:
  if ((int)uVar6 < 0) {
    uVar4 = -uVar6;
    if (uVar6 < 0xfffffff7) {
      fmt = "-0x%x";
    }
    else {
      fmt = "-%u";
    }
  }
  else {
    uVar4 = uVar6;
    if (uVar6 < 10) {
      fmt = "%u";
    }
    else {
      fmt = "0x%x";
    }
  }
  SStream_concat(O,fmt,(ulong)uVar4);
  if (MI->csh->detail == CS_OPT_OFF) {
    return;
  }
  pcVar3 = MI->flat_insn->detail;
  uVar9 = (ulong)(pcVar3->field_6).x86.rex;
  if (MI->csh->doing_mem == true) {
    *(uint *)(pcVar3->groups + uVar9 * 0xc + 0x22) = uVar6;
    return;
  }
  puVar2 = pcVar3->groups + uVar9 * 0xc + 0x1a;
  puVar2[0] = '\x02';
  puVar2[1] = '\0';
  puVar2[2] = '\0';
  puVar2[3] = '\0';
  pcVar3 = MI->flat_insn->detail;
  *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).x86.rex * 0xc + 0x1e) = uVar6;
LAB_001bb658:
  puVar2 = &(MI->flat_insn->detail->field_6).x86.rex;
  *puVar2 = *puVar2 + '\x01';
  return;
}

Assistant:

static void _printOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	MCOperand *Op  = MCInst_getOperand(MI, OpNo);
	if (MCOperand_isReg(Op)) {
		printRegName(O, MCOperand_getReg(Op));
	} else if (MCOperand_isImm(Op)) {
		int64_t imm = MCOperand_getImm(Op);
		if (imm < 0) {
			if (imm < -HEX_THRESHOLD)
				SStream_concat(O, "-0x%"PRIx64, -imm);
			else
				SStream_concat(O, "-%"PRIu64, -imm);

		} else {
			if (imm > HEX_THRESHOLD)
				SStream_concat(O, "0x%"PRIx64, imm);
			else
				SStream_concat(O, "%"PRIu64, imm);
		}
	}
}